

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::CylinderLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               CylinderLight *light,string *warn,string *err,PrimReconstructOptions *options)

{
  Variability *__lhs;
  uint uVar1;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  size_type sVar5;
  mapped_type *this;
  Property *pPVar6;
  Property *args;
  Property *pPVar7;
  char *pcVar8;
  string *psVar9;
  int iVar10;
  allocator local_339;
  string *local_338;
  Property *local_330;
  string *local_328;
  undefined4 local_31c;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_318;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_310;
  string local_308;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  ostringstream ss_e;
  code *local_238 [45];
  _Any_data local_d0;
  code *local_c0;
  _Any_data local_b0;
  code *local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = ReconstructXformOpsFromProperties
                    (spec,&table,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar2) {
    pPVar6 = (Property *)&(light->super_BoundableLight).purpose;
    local_310 = &(light->super_BoundableLight).visibility;
    pPVar7 = (Property *)(properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_338 = err;
    local_328 = warn;
    local_318 = (TypedAttributeWithFallback<tinyusdz::Purpose> *)pPVar6;
    while( true ) {
      bVar2 = pPVar7 == (Property *)&(properties->_M_t)._M_impl.super__Rb_tree_header;
      local_31c = (undefined4)CONCAT71((int7)((ulong)pPVar6 >> 8),bVar2);
      if (bVar2) break;
      __lhs = &(pPVar7->_attrib)._variability;
      ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
      pPVar6 = (Property *)(&(pPVar7->_attrib)._type_name.field_2._M_allocated_capacity + 1);
      psVar9 = (string *)&ss_e;
      ::std::__cxx11::string::string((string *)psVar9,"inputs:length",(allocator *)&local_308);
      anon_unknown_0::ParseTypedAttribute<float>(&ret,&table,&local_50,pPVar6,psVar9,&light->length)
      ;
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar10 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar2 = false;
        iVar10 = 3;
      }
      else {
        bVar2 = true;
        if (ret.code != Unmatched) {
          local_330 = pPVar7;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xcfb);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_268,"Parsing attribute `{}` failed. Error: {}",&local_339);
          fmt::format<char[14],std::__cxx11::string>
                    (&local_308,(fmt *)&local_268,(string *)"inputs:length",(char (*) [14])&ret.err,
                     psVar9);
          poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_308);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar9 = local_338;
          if (local_338 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+(&local_308,&local_268,psVar9);
            ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_308);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar2 = false;
          iVar10 = 1;
          pPVar7 = local_330;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&local_70,(string *)__lhs);
        psVar9 = (string *)&ss_e;
        ::std::__cxx11::string::string((string *)psVar9,"inputs:radius",(allocator *)&local_308);
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_70,pPVar6,psVar9,&light->radius);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar10 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar10 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            local_330 = pPVar7;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xcfc);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_268,"Parsing attribute `{}` failed. Error: {}",&local_339);
            fmt::format<char[14],std::__cxx11::string>
                      (&local_308,(fmt *)&local_268,(string *)"inputs:radius",
                       (char (*) [14])&ret.err,psVar9);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_308);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar9 = local_338;
            if (local_338 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_308,&local_268,psVar9);
              ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_308);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar10 = 1;
            pPVar7 = local_330;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001baeb5;
        ::std::__cxx11::string::string((string *)&local_90,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"extent",(allocator *)&local_308);
        args = pPVar6;
        anon_unknown_0::ParseExtentAttribute
                  (&ret,&table,&local_90,pPVar6,(string *)&ss_e,
                   &(light->super_BoundableLight).extent);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar10 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar10 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            local_330 = pPVar7;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xcfd);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_268,"Parsing attribute `extent` failed. Error: {}",
                       &local_339);
            fmt::format<std::__cxx11::string>
                      ((string *)&local_308,(fmt *)&local_268,(string *)&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_308);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar9 = local_338;
            if (local_338 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_308,&local_268,psVar9);
              ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_308);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar10 = 1;
            pPVar7 = local_330;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001baeb5;
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"visibility");
        if (bVar2) {
          ::std::__cxx11::string::string((string *)&ss_e,"visibility",(allocator *)&ret);
          sVar5 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&table,(key_type *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          if (sVar5 == 0) {
            Property::value_type_name_abi_cxx11_((string *)&ss_e,pPVar6);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var3 = ::std::operator==((string *)&ss_e,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret);
            if ((_Var3) &&
               (uVar1 = *(uint *)((long)&(pPVar7->_rel).targetPath._prop_part.field_2 + 4),
               uVar1 < 2)) {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (uVar1 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar4 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar4 = ::std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar4 = ::std::operator<<(poVar4,":");
                poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                poVar4 = ::std::operator<<(poVar4,"():");
                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xcff);
                ::std::operator<<(poVar4," ");
                poVar4 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                poVar4 = ::std::operator<<(poVar4,"visibility");
                poVar4 = ::std::operator<<(poVar4,"` token attribute. Set default token value.");
                ::std::operator<<(poVar4,"\n");
                psVar9 = local_328;
                if (local_328 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,&local_308,local_338);
                  ::std::__cxx11::string::operator=((string *)psVar9,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                AttrMetas::operator=
                          (&local_310->_metas,
                           (AttrMetas *)((long)&(pPVar7->_attrib)._metas.comment.contained + 0x20));
                pcVar8 = "visibility";
LAB_001bab33:
                ::std::__cxx11::string::string((string *)&ss_e,pcVar8,(allocator *)&ret);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e);
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001baec0;
              }
            }
            else {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            _ss_e = VisibilityEnumHandler;
            local_238[0] = ::std::
                           _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           ::_M_manager;
            ::std::__cxx11::string::string((string *)&ret,"visibility",(allocator *)&local_308);
            bVar2 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_b0,
                       (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&ss_e);
            bVar2 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                              ((string *)&ret,bVar2,
                               (EnumHandlerFun<tinyusdz::Visibility> *)&local_b0,(Attribute *)pPVar6
                               ,local_310,local_328,local_338);
            if (local_a0 != (code *)0x0) {
              (*local_a0)(&local_b0,&local_b0,__destroy_functor);
            }
            ::std::__cxx11::string::_M_dispose();
            iVar10 = 1;
            if (bVar2) {
              AttrMetas::operator=
                        (&local_310->_metas,
                         (AttrMetas *)((long)&(pPVar7->_attrib)._metas.comment.contained + 0x20));
              pcVar8 = "visibility";
LAB_001bae72:
              ::std::__cxx11::string::string((string *)&ret,pcVar8,(allocator *)&local_308);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
              ::std::__cxx11::string::_M_dispose();
              iVar10 = 3;
            }
LAB_001bae98:
            if (local_238[0] != (code *)0x0) {
              (*local_238[0])(&ss_e,&ss_e,3);
            }
            goto LAB_001baeb5;
          }
        }
        else {
          local_330 = pPVar6;
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"purpose");
          if (bVar2) {
            ::std::__cxx11::string::string((string *)&ss_e,"purpose",(allocator *)&ret);
            sVar5 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            pPVar6 = local_330;
            if (sVar5 == 0) {
              Property::value_type_name_abi_cxx11_((string *)&ss_e,local_330);
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var3 = ::std::operator==((string *)&ss_e,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&ret);
              if ((_Var3) &&
                 (uVar1 = *(uint *)((long)&(pPVar7->_rel).targetPath._prop_part.field_2 + 4),
                 uVar1 < 2)) {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (uVar1 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar4 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                  poVar4 = ::std::operator<<(poVar4,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                            );
                  poVar4 = ::std::operator<<(poVar4,":");
                  poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                  poVar4 = ::std::operator<<(poVar4,"():");
                  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xd01);
                  ::std::operator<<(poVar4," ");
                  poVar4 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                  poVar4 = ::std::operator<<(poVar4,"purpose");
                  poVar4 = ::std::operator<<(poVar4,"` token attribute. Set default token value.");
                  ::std::operator<<(poVar4,"\n");
                  psVar9 = local_328;
                  if (local_328 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ret,&local_308,local_338);
                    ::std::__cxx11::string::operator=((string *)psVar9,(string *)&ret);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  AttrMetas::operator=
                            (&local_318->_metas,
                             (AttrMetas *)((long)&(pPVar7->_attrib)._metas.comment.contained + 0x20)
                            );
                  pcVar8 = "purpose";
                  goto LAB_001bab33;
                }
              }
              else {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              _ss_e = PurposeEnumHandler;
              local_238[0] = ::std::
                             _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             ::_M_manager;
              ::std::__cxx11::string::string((string *)&ret,"purpose",(allocator *)&local_308);
              bVar2 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_d0,
                         (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&ss_e);
              bVar2 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                ((string *)&ret,bVar2,(EnumHandlerFun<tinyusdz::Purpose> *)&local_d0
                                 ,&pPVar6->_attrib,local_318,local_328,local_338);
              if (local_c0 != (code *)0x0) {
                (*local_c0)(&local_d0,&local_d0,__destroy_functor);
              }
              ::std::__cxx11::string::_M_dispose();
              iVar10 = 1;
              if (bVar2) {
                AttrMetas::operator=
                          (&local_318->_metas,
                           (AttrMetas *)((long)&(pPVar7->_attrib)._metas.comment.contained + 0x20));
                pcVar8 = "purpose";
                goto LAB_001bae72;
              }
              goto LAB_001bae98;
            }
          }
          else {
            sVar5 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)__lhs);
            if (sVar5 == 0) {
              this = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](&(light->super_BoundableLight).props,(key_type *)__lhs);
              Property::operator=(this,local_330);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs)
              ;
            }
            sVar5 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)__lhs);
            if (sVar5 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar4 = ::std::operator<<((ostream *)&ss_e,"[warn]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
              poVar4 = ::std::operator<<(poVar4,"():");
              poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xd03);
              ::std::operator<<(poVar4," ");
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __lhs);
              poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
              ::std::operator<<(poVar4,"\n");
              ::std::__cxx11::string::_M_dispose();
              psVar9 = local_328;
              if (local_328 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,&local_308,local_338);
                ::std::__cxx11::string::operator=((string *)psVar9,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            }
          }
        }
      }
      else {
LAB_001baeb5:
        if ((iVar10 != 3) && (iVar10 != 0)) break;
      }
LAB_001baec0:
      pPVar6 = (Property *)::std::_Rb_tree_increment((_Rb_tree_node_base *)pPVar7);
      pPVar7 = pPVar6;
    }
  }
  else {
    local_31c = 0;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return SUB41(local_31c,0);
}

Assistant:

bool ReconstructPrim<CylinderLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    CylinderLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:length", CylinderLight, light->length)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:radius", CylinderLight, light->radius)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, CylinderLight, light->extent)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, CylindrLight,
                   light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, CylinderLight,
                       light->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, SphereLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}